

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

JObject * __thiscall
pstack::JObject::
field<char[9],pstack::Mapper<pstack::ProgramHeaderName,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::map<unsigned_int,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>>>>>,pstack::Elf::Object_const*>
          (JObject *this,char (*k) [9],
          Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
          *v,Object **c)

{
  ostream *os;
  char *__s;
  size_t sVar1;
  JSON<pstack::Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>,_const_pstack::Elf::Object_*>
  local_48;
  undefined1 local_38 [8];
  Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>
  field;
  
  os = this->os;
  __s = this->sep;
  local_38 = (undefined1  [8])k;
  field.k = (char (*) [9])v;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  local_48.object =
       (Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>
        *)local_38;
  local_48.context = c;
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }